

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,String *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,ArrayPtr<const_char> *params_9,String *params_10,
          ArrayPtr<const_char> *params_11,CappedArray<char,_14UL> *params_12,
          ArrayPtr<const_char> *params_13)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  const_iterator __begin2;
  char *pos;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t elementCount;
  size_t local_d8;
  char *pcStack_d0;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  size_t local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined8 local_70;
  String local_68;
  StringTree *local_50;
  ArrayPtr<const_char> *local_48;
  ArrayPtr<const_char> *local_40;
  ArrayPtr<const_char> *local_38;
  
  lVar6 = 0;
  lVar7 = 0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  *(undefined1 (*) [16])&(__return_storage_ptr__->text).content.disposer = (undefined1  [16])0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_d8 = this->size_;
  pcStack_d0 = (params->text).content.ptr;
  lVar5 = 0;
  local_c8 = params_1->size_ - 1;
  if (params_1->size_ == 0) {
    local_c8 = lVar5;
  }
  local_c0._0_8_ = (params_2->content).size_;
  local_c0._8_8_ = params_3->size_;
  local_b0._0_8_ = params_4->size_;
  local_b0._8_8_ = params_5->size_;
  local_a0._0_8_ = params_6->size_;
  local_a0._8_8_ = params_7->size_;
  local_90 = params_8->size_;
  local_88 = params_9->size_ - 1;
  if (params_9->size_ == 0) {
    local_88 = lVar5;
  }
  local_80._0_8_ = (params_10->content).size_;
  local_80._8_8_ = params_11->ptr;
  local_70 = *(undefined8 *)params_12->content;
  do {
    lVar6 = lVar6 + (&local_d8)[lVar5];
    lVar7 = lVar7 + (&local_d8)[lVar5 + 1];
    lVar5 = lVar5 + 2;
  } while (lVar5 != 0xe);
  __return_storage_ptr__->size_ = lVar7 + lVar6;
  lVar5 = 0;
  local_d8 = 0;
  local_c8 = 0;
  local_88 = 0;
  lVar6 = 0;
  lVar7 = 0;
  do {
    lVar6 = lVar6 + (&local_d8)[lVar5];
    lVar7 = lVar7 + (&local_d8)[lVar5 + 1];
    lVar5 = lVar5 + 2;
  } while (lVar5 != 0xe);
  local_50 = params;
  local_48 = params_1;
  local_40 = params_3;
  local_38 = (ArrayPtr<const_char> *)params_2;
  heapString(&local_68,lVar7 + lVar6);
  (__return_storage_ptr__->text).content.ptr = local_68.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_68.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_68.content.disposer;
  local_d8 = 1;
  lVar5 = 0;
  pcStack_d0 = (char *)0x0;
  local_c8 = 1;
  lVar6 = 0;
  lVar7 = 0;
  local_c0 = (undefined1  [16])0x0;
  local_b0 = (undefined1  [16])0x0;
  local_a0 = (undefined1  [16])0x0;
  local_90 = 0;
  local_88 = 1;
  local_80 = (undefined1  [16])0x0;
  local_70 = 0;
  do {
    lVar6 = lVar6 + (&local_d8)[lVar5];
    lVar7 = lVar7 + (&local_d8)[lVar5 + 1];
    lVar5 = lVar5 + 2;
  } while (lVar5 != 0xe);
  elementCount = lVar7 + lVar6;
  pBVar4 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,elementCount,elementCount,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::construct,
                      ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_68.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_68.content.ptr = (char *)pBVar4;
  local_68.content.size_ = elementCount;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar4;
  (__return_storage_ptr__->branches).size_ = elementCount;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,this,(ArrayPtr<const_char> *)local_50,(String *)local_48,
             local_38,local_40,params_4,params_5,params_6,params_7,params_8,(String *)params_9,
             (ArrayPtr<const_char> *)params_10,(CappedArray<char,_14UL> *)params_11,
             (ArrayPtr<const_char> *)params_12);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}